

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O0

void __thiscall zmq::session_base_t::read_activated(session_base_t *this,pipe_t *pipe_)

{
  size_type sVar1;
  set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_> *in_RSI;
  long in_RDI;
  pipe_t *in_stack_00000028;
  undefined7 in_stack_ffffffffffffffe8;
  bool bVar2;
  
  bVar2 = false;
  if (in_RSI != *(set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_> **)
                 (in_RDI + 0x588)) {
    bVar2 = in_RSI != *(set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
                        **)(in_RDI + 0x590);
  }
  if (bVar2 == false) {
    if (*(long *)(in_RDI + 0x5d0) == 0) {
      if (*(long *)(in_RDI + 0x588) != 0) {
        pipe_t::check_read(in_stack_00000028);
      }
    }
    else if (in_RSI == *(set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
                         **)(in_RDI + 0x588)) {
      (**(code **)(**(long **)(in_RDI + 0x5d0) + 0x30))();
    }
    else {
      (**(code **)(**(long **)(in_RDI + 0x5d0) + 0x38))();
    }
  }
  else {
    sVar1 = std::set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>::count
                      (in_RSI,(key_type *)CONCAT17(bVar2,in_stack_ffffffffffffffe8));
    if (sVar1 != 1) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_terminating_pipes.count (pipe_) == 1",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
              ,0x132);
      fflush(_stderr);
      zmq_abort((char *)0x234a6c);
    }
  }
  return;
}

Assistant:

void zmq::session_base_t::read_activated (pipe_t *pipe_)
{
    // Skip activating if we're detaching this pipe
    if (unlikely (pipe_ != _pipe && pipe_ != _zap_pipe)) {
        zmq_assert (_terminating_pipes.count (pipe_) == 1);
        return;
    }

    if (unlikely (_engine == NULL)) {
        if (_pipe)
            _pipe->check_read ();
        return;
    }

    if (likely (pipe_ == _pipe))
        _engine->restart_output ();
    else {
        // i.e. pipe_ == zap_pipe
        _engine->zap_msg_available ();
    }
}